

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O0

char * __thiscall XMLParser::ToXMLStringTool::toXML(ToXMLStringTool *this,char *source)

{
  int iVar1;
  void *pvVar2;
  int l;
  char *source_local;
  ToXMLStringTool *this_local;
  
  if (source == (char *)0x0) {
    if (*(int *)(this + 8) < 1) {
      *(undefined4 *)(this + 8) = 1;
      pvVar2 = malloc(1);
      *(void **)this = pvVar2;
    }
    **(undefined1 **)this = 0;
    this_local = *(ToXMLStringTool **)this;
  }
  else {
    iVar1 = lengthXMLString(source);
    iVar1 = iVar1 + 1;
    if (*(int *)(this + 8) < iVar1) {
      freeBuffer(this);
      *(int *)(this + 8) = iVar1;
      pvVar2 = malloc((long)iVar1);
      *(void **)this = pvVar2;
    }
    this_local = (ToXMLStringTool *)toXMLUnSafe(*(char **)this,source);
  }
  return (char *)this_local;
}

Assistant:

XMLSTR ToXMLStringTool::toXML(XMLCSTR source)
    {
        if(!source)
        {
            if(buflen < 1)
            {
                buflen = 1;
                buf = (XMLSTR)malloc(sizeof(XMLCHAR));
            }
            *buf = 0;
            return buf;
        }
        int l = lengthXMLString(source) + 1;
        if(l > buflen)
        {
            freeBuffer();
            buflen = l;
            buf = (XMLSTR)malloc(l * sizeof(XMLCHAR));
        }
        return toXMLUnSafe(buf, source);
    }